

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O0

void __thiscall NFALUT::NFALUT(NFALUT *this,int size,double _prob,double _logNT)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  double local_38;
  double ret;
  int i;
  int j;
  double _logNT_local;
  double _prob_local;
  int size_local;
  NFALUT *this_local;
  
  this->LUTSize = size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->LUTSize;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  piVar3 = (int *)operator_new__(uVar2);
  this->LUT = piVar3;
  this->prob = _prob;
  this->logNT = _logNT;
  *this->LUT = 1;
  ret._4_4_ = 1;
  ret._0_4_ = 1;
  do {
    if (this->LUTSize <= ret._0_4_) {
      return;
    }
    this->LUT[ret._0_4_] = this->LUTSize + 1;
    local_38 = nfa(this,ret._0_4_,ret._4_4_);
    if (0.0 <= local_38) {
LAB_00135546:
      this->LUT[ret._0_4_] = ret._4_4_;
    }
    else {
      do {
        if (ret._0_4_ <= ret._4_4_) break;
        ret._4_4_ = ret._4_4_ + 1;
        local_38 = nfa(this,ret._0_4_,ret._4_4_);
      } while (local_38 < 0.0);
      if (0.0 <= local_38) goto LAB_00135546;
    }
    ret._0_4_ = ret._0_4_ + 1;
  } while( true );
}

Assistant:

NFALUT::NFALUT(int size, double _prob, double _logNT)
{
	LUTSize = size;
	LUT = new int[LUTSize];

	prob = _prob;
	logNT = _logNT;

	LUT[0] = 1;
	int j = 1;
	for (int i = 1; i<LUTSize; i++) {
		LUT[i] = LUTSize + 1;
		double ret = nfa(i, j);
		if (ret < 0) {
			while (j < i) {
				j++;
				ret = nfa(i, j);
				if (ret >= 0) break;
			} //end-while

			if (ret < 0) continue;
		} //end-if

		LUT[i] = j;
	} //end-for
}